

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UILoader.cpp
# Opt level: O3

void UI::LoaderLoadingModal(shared_ptr<LoaderThread> *loader_thread)

{
  bool bVar1;
  ImU32 local_c;
  
  ImGui::SetNextWindowCentering();
  bVar1 = ImGui::BeginPopupModal("Loading",(bool *)0x0,0x45);
  if (bVar1) {
    local_c = ImGui::GetColorU32(0x16,1.0);
    ImGui::Spinner("##spinner",12.0,6,&local_c);
    ImGui::SameLine(0.0,-1.0);
    ImGui::TextUnformatted
              ((((loader_thread->super___shared_ptr<LoaderThread,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_notification)._M_b._M_p,(char *)0x0);
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void LoaderLoadingModal(const std::shared_ptr<LoaderThread> &loader_thread) {
	ImGui::SetNextWindowCentering();
	if (ImGui::BeginPopupModal(kLoaderLoadingModal, nullptr,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar |
	                               ImGuiWindowFlags_NoMove)) {
		ImGui::Spinner("##spinner", 12, 6, ImGui::GetColorU32(ImGuiCol_ButtonHovered));
		ImGui::SameLine();
		ImGui::TextUnformatted(loader_thread->GetNotification());

		ImGui::EndPopup();
	}
}